

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator,PageSegmentBase<Memory::VirtualAllocWrapper> *element)

{
  code *pcVar1;
  bool bVar2;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar3;
  undefined4 *puVar4;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *buffer;
  
  buffer = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
           (element[-1].decommitPages.data + 4);
  pDVar3 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this;
  do {
    pDVar3 = (pDVar3->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).
             next.node;
    if (pDVar3 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this) break;
  } while (pDVar3 != buffer);
  if (pDVar3 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  **(anon_union_8_3_7fb8a913_for_next **)&element[-1].freePageCount =
       (buffer->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next;
  ((buffer->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base)->
  prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
            (&element->super_SegmentBase<Memory::VirtualAllocWrapper>);
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x98);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }